

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O2

bool __thiscall re2::Regexp::ParseState::MaybeConcatString(ParseState *this,int r,ParseFlags flags)

{
  Rune r_00;
  Regexp *this_00;
  Regexp *this_01;
  uint8 uVar1;
  int i;
  long lVar2;
  
  this_00 = this->stacktop_;
  if ((((this_00 != (Regexp *)0x0) && (this_01 = this_00->down_, this_01 != (Regexp *)0x0)) &&
      (uVar1 = this_00->op_, (byte)(uVar1 - 3) < 2)) &&
     (((byte)(this_01->op_ - 3) < 2 && (((this_01->parse_flags_ ^ this_00->parse_flags_) & 1) == 0))
     )) {
    if (this_01->op_ == '\x03') {
      r_00 = (this_01->field_7).rune_;
      this_01->op_ = '\x04';
      (this_01->field_7).field_0.max_ = 0;
      (this_01->field_7).field_1.name_ = (string *)0x0;
      AddRuneToString(this_01,r_00);
      uVar1 = this_00->op_;
    }
    if (uVar1 == '\x03') {
      AddRuneToString(this_01,(this_00->field_7).rune_);
    }
    else {
      for (lVar2 = 0; lVar2 < (this_00->field_7).field_0.max_; lVar2 = lVar2 + 1) {
        AddRuneToString(this_01,*(Rune *)((long)&(((this_00->field_7).field_1.name_)->_M_dataplus).
                                                 _M_p + lVar2 * 4));
      }
      (this_00->field_7).field_0.max_ = 0;
      if ((this_00->field_7).the_union_[1] != (void *)0x0) {
        operator_delete__((this_00->field_7).the_union_[1]);
      }
      (this_00->field_7).field_1.name_ = (string *)0x0;
    }
    if (-1 < r) {
      this_00->op_ = '\x03';
      (this_00->field_7).field_0.max_ = r;
      this_00->parse_flags_ = (uint16)flags;
      return true;
    }
    this->stacktop_ = this_01;
    Decref(this_00);
  }
  return false;
}

Assistant:

bool Regexp::ParseState::MaybeConcatString(int r, ParseFlags flags) {
  Regexp* re1;
  Regexp* re2;
  if ((re1 = stacktop_) == NULL || (re2 = re1->down_) == NULL)
    return false;

  if (re1->op_ != kRegexpLiteral && re1->op_ != kRegexpLiteralString)
    return false;
  if (re2->op_ != kRegexpLiteral && re2->op_ != kRegexpLiteralString)
    return false;
  if ((re1->parse_flags_ & FoldCase) != (re2->parse_flags_ & FoldCase))
    return false;

  if (re2->op_ == kRegexpLiteral) {
    // convert into string
    Rune rune = re2->rune_;
    re2->op_ = kRegexpLiteralString;
    re2->nrunes_ = 0;
    re2->runes_ = NULL;
    re2->AddRuneToString(rune);
  }

  // push re1 into re2.
  if (re1->op_ == kRegexpLiteral) {
    re2->AddRuneToString(re1->rune_);
  } else {
    for (int i = 0; i < re1->nrunes_; i++)
      re2->AddRuneToString(re1->runes_[i]);
    re1->nrunes_ = 0;
    delete[] re1->runes_;
    re1->runes_ = NULL;
  }

  // reuse re1 if possible
  if (r >= 0) {
    re1->op_ = kRegexpLiteral;
    re1->rune_ = r;
    re1->parse_flags_ = static_cast<uint16>(flags);
    return true;
  }

  stacktop_ = re2;
  re1->Decref();
  return false;
}